

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.h
# Opt level: O3

void __thiscall
pbrt::OrthographicCamera::OrthographicCamera
          (OrthographicCamera *this,CameraBaseParameters *baseParameters,Bounds2f *screenWindow,
          Float lensRadius,Float focalDistance)

{
  float fVar1;
  Float FVar2;
  float fVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  Transform local_3f0;
  CameraBaseParameters local_370;
  
  memcpy(&local_370,baseParameters,0x340);
  local_370.film.super_TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm>.bits =
       (TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm>)
       (baseParameters->film).super_TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm>.bits;
  local_370.medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
           )(baseParameters->medium).
            super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
            .bits;
  Orthographic(&local_3f0,0.0,1.0);
  ProjectiveCamera::ProjectiveCamera
            (&this->super_ProjectiveCamera,&local_370,&local_3f0,screenWindow,lensRadius,
             focalDistance);
  fVar1 = (this->super_ProjectiveCamera).cameraFromRaster.m.m[2][1];
  auVar11 = ZEXT816(0) << 0x40;
  FVar2 = (this->super_ProjectiveCamera).cameraFromRaster.m.m[2][2];
  auVar7 = ZEXT416((uint)(this->super_ProjectiveCamera).cameraFromRaster.m.m[0][1]);
  auVar10 = ZEXT416((uint)(this->super_ProjectiveCamera).cameraFromRaster.m.m[1][1]);
  auVar5 = vinsertps_avx(auVar7,auVar10,0x10);
  auVar6 = ZEXT416((uint)(this->super_ProjectiveCamera).cameraFromRaster.m.m[0][0]);
  auVar9 = ZEXT416((uint)(this->super_ProjectiveCamera).cameraFromRaster.m.m[1][0]);
  auVar8 = vinsertps_avx(auVar6,auVar9,0x10);
  auVar6 = vfmadd213ss_fma(auVar6,auVar11,auVar7);
  auVar7 = vfmadd213ss_fma(auVar9,auVar11,auVar10);
  auVar10._0_4_ = auVar8._0_4_ + auVar5._0_4_ * 0.0;
  auVar10._4_4_ = auVar8._4_4_ + auVar5._4_4_ * 0.0;
  auVar10._8_4_ = auVar8._8_4_ + auVar5._8_4_ * 0.0;
  auVar10._12_4_ = auVar8._12_4_ + auVar5._12_4_ * 0.0;
  auVar8 = ZEXT416((uint)(this->super_ProjectiveCamera).cameraFromRaster.m.m[0][2]);
  auVar9 = ZEXT416((uint)(this->super_ProjectiveCamera).cameraFromRaster.m.m[1][2]);
  auVar5 = vinsertps_avx(auVar8,auVar9,0x10);
  auVar6 = vfmadd231ss_fma(auVar6,auVar11,auVar8);
  auVar7 = vfmadd231ss_fma(auVar7,auVar11,auVar9);
  auVar8 = vfmadd213ps_fma(auVar5,ZEXT816(0) << 0x40,auVar10);
  fVar3 = (this->super_ProjectiveCamera).cameraFromRaster.m.m[2][0];
  auVar5 = vinsertps_avx(auVar6,auVar7,0x10);
  uVar4 = vmovlps_avx(auVar8);
  (this->dxCamera).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar4;
  (this->dxCamera).super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar4 >> 0x20);
  auVar8 = vfmadd213ss_fma(ZEXT416((uint)fVar3),auVar11,ZEXT416((uint)fVar1));
  auVar7 = ZEXT416((uint)FVar2);
  auVar6 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * 0.0 + fVar3)),auVar7,auVar11);
  auVar8 = vfmadd231ss_fma(auVar8,auVar7,ZEXT816(0));
  (this->dxCamera).super_Tuple3<pbrt::Vector3,_float>.z = auVar6._0_4_;
  uVar4 = vmovlps_avx(auVar5);
  (this->dyCamera).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar4;
  (this->dyCamera).super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar4 >> 0x20);
  (this->dyCamera).super_Tuple3<pbrt::Vector3,_float>.z = auVar8._0_4_;
  (this->super_ProjectiveCamera).super_CameraBase.minDirDifferentialY.
  super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
  (this->super_ProjectiveCamera).super_CameraBase.minDirDifferentialY.
  super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
  (this->super_ProjectiveCamera).super_CameraBase.minDirDifferentialY.
  super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
  (this->super_ProjectiveCamera).super_CameraBase.minDirDifferentialX.
  super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
  (this->super_ProjectiveCamera).super_CameraBase.minDirDifferentialX.
  super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
  (this->super_ProjectiveCamera).super_CameraBase.minDirDifferentialX.
  super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
  (this->super_ProjectiveCamera).super_CameraBase.minPosDifferentialX.
  super_Tuple3<pbrt::Vector3,_float>.z = (this->dxCamera).super_Tuple3<pbrt::Vector3,_float>.z;
  fVar1 = (this->dxCamera).super_Tuple3<pbrt::Vector3,_float>.y;
  (this->super_ProjectiveCamera).super_CameraBase.minPosDifferentialX.
  super_Tuple3<pbrt::Vector3,_float>.x = (this->dxCamera).super_Tuple3<pbrt::Vector3,_float>.x;
  (this->super_ProjectiveCamera).super_CameraBase.minPosDifferentialX.
  super_Tuple3<pbrt::Vector3,_float>.y = fVar1;
  (this->super_ProjectiveCamera).super_CameraBase.minPosDifferentialY.
  super_Tuple3<pbrt::Vector3,_float>.z = (this->dyCamera).super_Tuple3<pbrt::Vector3,_float>.z;
  fVar1 = (this->dyCamera).super_Tuple3<pbrt::Vector3,_float>.y;
  (this->super_ProjectiveCamera).super_CameraBase.minPosDifferentialY.
  super_Tuple3<pbrt::Vector3,_float>.x = (this->dyCamera).super_Tuple3<pbrt::Vector3,_float>.x;
  (this->super_ProjectiveCamera).super_CameraBase.minPosDifferentialY.
  super_Tuple3<pbrt::Vector3,_float>.y = fVar1;
  return;
}

Assistant:

OrthographicCamera(CameraBaseParameters baseParameters, const Bounds2f &screenWindow,
                       Float lensRadius, Float focalDistance)
        : ProjectiveCamera(baseParameters, Orthographic(0, 1), screenWindow, lensRadius,
                           focalDistance) {
        // Compute differential changes in origin for orthographic camera rays
        dxCamera = cameraFromRaster(Vector3f(1, 0, 0));
        dyCamera = cameraFromRaster(Vector3f(0, 1, 0));

        // Compute minimum differentials for orthographic camera
        minDirDifferentialX = minDirDifferentialY = Vector3f(0, 0, 0);
        minPosDifferentialX = dxCamera;
        minPosDifferentialY = dyCamera;
    }